

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O2

TRef fold_simplify_intsubadd_leftcancel(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  bool bVar4;
  
  if ((((J->fold).ins.field_1.t.irt & 0x1f) != 0xe) &&
     (((J->fold).left[0].field_1.t.irt & 0x40) == 0)) {
    uVar1 = (J->fold).ins.field_0.op2;
    uVar2 = (J->fold).left[0].field_0.op1;
    uVar3 = (J->fold).left[0].field_0.op2;
    if ((uVar1 == uVar2) || (bVar4 = uVar1 == uVar3, uVar3 = uVar2, bVar4)) goto LAB_0012d632;
  }
  uVar3 = 0;
LAB_0012d632:
  return (TRef)uVar3;
}

Assistant:

LJFOLD(SUB ADD any)
LJFOLDF(simplify_intsubadd_leftcancel)
{
  if (!irt_isnum(fins->t)) {
    PHIBARRIER(fleft);
    if (fins->op2 == fleft->op1)  /* (i + j) - i ==> j */
      return fleft->op2;
    if (fins->op2 == fleft->op2)  /* (i + j) - j ==> i */
      return fleft->op1;
  }
  return NEXTFOLD;
}